

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void * Realloc(void *ptr,size_t size)

{
  void *__dest;
  
  __dest = ptr;
  if (*(ulong *)((long)ptr + -8) < size) {
    __dest = Malloc(size);
    if (__dest == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      memcpy(__dest,ptr,*(size_t *)((long)ptr + -8));
      Free(ptr);
    }
  }
  return __dest;
}

Assistant:

void *Realloc(void *ptr, size_t size)
{
  struct MemInfo *point;
  void *new;
  /* `point' points to the MemInfo structure: */
  point=(struct MemInfo *)((char *)ptr-sizeof(struct MemInfo));
 
  if(size<=point->size)
    /*
     * To increase performance, don't care about reallocing
     * to smaller sizes!
     */
    return(ptr);
  new=Malloc(size); /* allocate new storage */
  if(!new)
    return(NULL); /* fail! */
  
  memcpy(new, ptr, point->size); /* copy contents */

  Free(ptr); /* free old area */

  return(new); /* return new pointer */
}